

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O2

void __thiscall MxxColl_AllgathervGeneral_Test::TestBody(MxxColl_AllgathervGeneral_Test *this)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  size_t i;
  size_type sVar4;
  ulong uVar5;
  size_type __n;
  int iVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  AssertHelper local_110;
  int local_104;
  _Vector_base<int,_std::allocator<int>_> local_100;
  AssertionResult gtest_ar;
  size_t total_size;
  vector<int,_std::allocator<int>_> all;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  comm c;
  vector<int,_std::allocator<int>_> els;
  
  mxx::comm::comm(&c);
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = (size_type)(c.m_rank * 5 + 10);
  std::vector<int,_std::allocator<int>_>::vector(&els,__n,(allocator_type *)&gtest_ar);
  iVar1 = 0;
  for (sVar4 = 0; __n != sVar4; sVar4 = sVar4 + 1) {
    els.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [sVar4] = c.m_rank * 0xd + iVar1;
    iVar1 = iVar1 + -0x2a;
  }
  all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  total_size = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&recv_sizes,(long)c.m_size);
  uVar5 = 0;
  uVar2 = (ulong)(uint)c.m_size;
  if (c.m_size < 1) {
    uVar2 = uVar5;
  }
  lVar7 = 0xa00000000;
  for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar5] = lVar7 >> 0x20;
    total_size = total_size + (lVar7 >> 0x20);
    lVar7 = lVar7 + 0x500000000;
  }
  std::vector<int,_std::allocator<int>_>::resize(&all,total_size);
  mxx::allgatherv<int>
            (els.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,__n,
             all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,&recv_sizes,&c);
  iVar1 = 10;
  iVar3 = 0;
  lVar7 = 0;
  iVar6 = 0;
  while( true ) {
    iVar10 = 0;
    if (0 < iVar1) {
      iVar10 = iVar1;
    }
    if (c.m_size <= iVar6) break;
    lVar9 = lVar7 * 4;
    local_104 = iVar1;
    iVar1 = iVar3;
    for (lVar11 = 0; -iVar10 != (int)lVar11; lVar11 = lVar11 + -1) {
      local_100._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_100._M_impl.super__Vector_impl_data._M_start._4_4_,iVar1);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"i*13 - 42*j","all[pos++]",(int *)&local_100,
                 (int *)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar9));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_100);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                   ,0x1e5,pcVar8);
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_100);
LAB_0014f1c4:
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_100);
        goto LAB_0014f1dd;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      lVar9 = lVar9 + 4;
      iVar1 = iVar1 + -0x2a;
    }
    iVar6 = iVar6 + 1;
    iVar1 = local_104 + 5;
    lVar7 = lVar7 - lVar11;
    iVar3 = iVar3 + 0xd;
  }
  mxx::allgatherv<int>
            ((vector<int,_std::allocator<int>_> *)&gtest_ar,
             els.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,__n,&recv_sizes,&c);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&all,&gtest_ar);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&gtest_ar);
  local_100._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"total_size","all.size()",&total_size,(unsigned_long *)&local_100
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
               ,0x1ea,pcVar8);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_100);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    iVar1 = 10;
    iVar3 = 0;
    lVar7 = 0;
    iVar6 = 0;
    while( true ) {
      iVar10 = 0;
      if (0 < iVar1) {
        iVar10 = iVar1;
      }
      if (c.m_size <= iVar6) break;
      lVar9 = lVar7 * 4;
      local_104 = iVar1;
      iVar1 = iVar3;
      for (lVar11 = 0; -iVar10 != (int)lVar11; lVar11 = lVar11 + -1) {
        local_100._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_100._M_impl.super__Vector_impl_data._M_start._4_4_,iVar1);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"i*13 - 42*j","all[pos++]",(int *)&local_100,
                   (int *)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar9));
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_100);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                     ,0x1ee,pcVar8);
          testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_100);
          goto LAB_0014f1c4;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        lVar9 = lVar9 + 4;
        iVar1 = iVar1 + -0x2a;
      }
      iVar6 = iVar6 + 1;
      iVar1 = local_104 + 5;
      lVar7 = lVar7 - lVar11;
      iVar3 = iVar3 + 0xd;
    }
    mxx::comm::comm((comm *)&gtest_ar);
    mxx::allgatherv<int>
              ((vector<int,_std::allocator<int>_> *)&local_100,&els,&recv_sizes,(comm *)&gtest_ar);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&all,&local_100);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_100);
    mxx::comm::~comm((comm *)&gtest_ar);
    local_100._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"total_size","all.size()",&total_size,
               (unsigned_long *)&local_100);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_104 = 10;
      iVar1 = 0;
      lVar7 = 0;
      iVar3 = 0;
      while( true ) {
        iVar6 = 0;
        if (0 < local_104) {
          iVar6 = local_104;
        }
        if (c.m_size <= iVar3) break;
        lVar9 = lVar7 * 4;
        iVar10 = iVar1;
        for (lVar11 = 0; -iVar6 != (int)lVar11; lVar11 = lVar11 + -1) {
          local_100._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_100._M_impl.super__Vector_impl_data._M_start._4_4_,iVar10);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"i*13 - 42*j","all[pos++]",(int *)&local_100,
                     (int *)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar9));
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_100);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar8 = "";
            }
            else {
              pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_110,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                       ,0x1f7,pcVar8);
            testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_100);
            goto LAB_0014f1c4;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          lVar9 = lVar9 + 4;
          iVar10 = iVar10 + -0x2a;
        }
        iVar3 = iVar3 + 1;
        local_104 = local_104 + 5;
        lVar7 = lVar7 - lVar11;
        iVar1 = iVar1 + 0xd;
      }
      goto LAB_0014f1e2;
    }
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
               ,499,pcVar8);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_100);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_110);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_100);
LAB_0014f1dd:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
LAB_0014f1e2:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&all.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&els.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxColl, AllgathervGeneral) {
    mxx::comm c;
    std::vector<size_t> recv_sizes;
    // fill elements
    size_t size = 5*(c.rank()+2);
    std::vector<int> els(size);
    for (size_t i = 0; i < size; ++i) {
        els[i] = c.rank()*13 - 42*i;
    }
    // prepare recv sizes and output vector
    std::vector<int> all;
    size_t total_size = 0;
    recv_sizes.resize(c.size());
    for (int i = 0; i < c.size(); ++i) {
        recv_sizes[i] = 5*(i+2);
        total_size += recv_sizes[i];
    }
    all.resize(total_size);

    // general gatherv
    mxx::allgatherv(&els[0], size, &all[0], recv_sizes, c);
    size_t pos = 0;
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (5*(i+2)); ++j) {
            ASSERT_EQ(i*13 - 42*j, all[pos++]);
        }
    }
    // convenience functions
    all = mxx::allgatherv(&els[0], size, recv_sizes, c);
    ASSERT_EQ(total_size, all.size());
    pos = 0;
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (5*(i+2)); ++j) {
            ASSERT_EQ(i*13 - 42*j, all[pos++]);
        }
    }
    // convenience functions
    all = mxx::allgatherv(els, recv_sizes);
    ASSERT_EQ(total_size, all.size());
    pos = 0;
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (5*(i+2)); ++j) {
            ASSERT_EQ(i*13 - 42*j, all[pos++]);
        }
    }
}